

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fibonacci.cpp
# Opt level: O0

int genFibonacci(int *num)

{
  int iVar1;
  int iVar2;
  int local_20;
  int local_1c;
  int *local_18;
  int *num_local;
  
  if (*num == 0) {
    num_local._4_4_ = 0;
  }
  else if (*num == 1) {
    num_local._4_4_ = 1;
  }
  else {
    local_1c = *num + -1;
    local_18 = num;
    iVar1 = genFibonacci(&local_1c);
    local_20 = *local_18 + -2;
    iVar2 = genFibonacci(&local_20);
    num_local._4_4_ = iVar1 + iVar2;
  }
  return num_local._4_4_;
}

Assistant:

inline int genFibonacci(const int& num){
    if(num == 0){
        return 0;
    } else if(num == 1){
        return 1;
    } else {
        return genFibonacci(num-1)+genFibonacci(num-2);
    }
}